

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O3

void __thiscall
google::
dense_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
::set_empty_key(dense_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::dense_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
                *this,key_type *key)

{
  int iVar1;
  size_type sVar2;
  pointer ppVar3;
  size_type sVar4;
  int iVar5;
  
  (this->settings).super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  use_empty_ = true;
  iVar5 = g_num_copies + 1;
  iVar1 = key->i_;
  g_num_copies = iVar5;
  (this->key_info).empty_key.i_ = iVar1;
  *(undefined8 *)(this->key_info).empty_key.buffer_ = *(undefined8 *)key->buffer_;
  *(undefined4 *)((this->key_info).empty_key.buffer_ + 8) = *(undefined4 *)(key->buffer_ + 8);
  sVar2 = this->num_buckets;
  ppVar3 = (pointer)malloc(sVar2 * 0x14);
  this->table = ppVar3;
  if (sVar2 != 0) {
    sVar4 = sVar2;
    do {
      (ppVar3->first).i_ = iVar1;
      *(undefined8 *)(ppVar3->first).buffer_ = *(undefined8 *)(this->key_info).empty_key.buffer_;
      *(undefined4 *)((ppVar3->first).buffer_ + 8) =
           *(undefined4 *)((this->key_info).empty_key.buffer_ + 8);
      ppVar3->second = 0;
      ppVar3 = ppVar3 + 1;
      sVar4 = sVar4 - 1;
    } while (sVar4 != 0);
    g_num_copies = iVar5 + (int)sVar2;
  }
  return;
}

Assistant:

void set_empty_key(const key_type& key) {
    // Once you set the empty key, you can't change it
    assert(!settings.use_empty() && "Calling set_empty_key multiple times");
    // The deleted indicator (if specified) and the empty indicator
    // must be different.
    assert(
        (!settings.use_deleted() || !equals(key, key_info.delkey)) &&
        "Setting the empty key the same as the deleted key");
    settings.set_use_empty(true);
    key_info.empty_key = key;

    assert(!table);  // must set before first use
    // num_buckets was set in constructor even though table was NULL
    table = val_info.allocate(num_buckets);
    assert(table);
    fill_range_with_empty(table, num_buckets);
  }